

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GPIOClass.cpp
# Opt level: O2

int __thiscall GPIOClass::setdir_gpio(GPIOClass *this,string *dir)

{
  ostream *poVar1;
  int iVar2;
  string setdir_str;
  ofstream setdirgpio;
  byte abStack_1f8 [480];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&setdirgpio,
                 "/sys/class/gpio/gpio",&this->gpionum);
  std::operator+(&setdir_str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&setdirgpio,
                 "/direction");
  std::__cxx11::string::~string((string *)&setdirgpio);
  std::ofstream::ofstream(&setdirgpio,setdir_str._M_dataplus._M_p,_S_out);
  if ((abStack_1f8[*(long *)(_setdirgpio + -0x18)] & 5) == 0) {
    std::operator<<((ostream *)&setdirgpio,(string *)dir);
    iVar2 = 0;
    std::ofstream::close();
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             " OPERATION FAILED: Unable to set direction of GPIO");
    poVar1 = std::operator<<(poVar1,(string *)this);
    poVar1 = std::operator<<(poVar1," .");
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = -1;
  }
  std::ofstream::~ofstream(&setdirgpio);
  std::__cxx11::string::~string((string *)&setdir_str);
  return iVar2;
}

Assistant:

int GPIOClass::setdir_gpio(string dir)
{

    string setdir_str ="/sys/class/gpio/gpio" + this->gpionum + "/direction";
    ofstream setdirgpio(setdir_str.c_str()); // open direction file for gpio
        if (!setdirgpio){
            cout << " OPERATION FAILED: Unable to set direction of GPIO"<< this->gpionum <<" ."<< endl;
            return -1;
        }

        setdirgpio << dir; //write direction to direction file
        setdirgpio.close(); // close direction file
        return 0;
}